

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.hpp
# Opt level: O0

extent<pstore::repo::compilation>
pstore::repo::compilation::
alloc<pstore::transaction_base,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
          (transaction_base *transaction,typed_address<pstore::indirect_string> triple,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          first_member,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          last_member)

{
  uint uVar1;
  int iVar2;
  difference_type dVar3;
  size_t s;
  undefined4 extraout_var;
  element_type *ptr_00;
  compilation *this;
  typed_address<pstore::repo::compilation> local_c0;
  definition *local_b8;
  definition *local_b0;
  address local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined1 local_88 [24];
  shared_ptr<pstore::repo::compilation> ptr;
  address addr;
  size_t size;
  size_type num_members;
  size_type local_40;
  difference_type dist;
  transaction_base *transaction_local;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  last_member_local;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  first_member_local;
  typed_address<pstore::indirect_string> triple_local;
  
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                    (first_member,last_member);
  if (dVar3 < 0) {
    assert_failed("dist >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                  ,0x11e);
  }
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if ((long)(ulong)uVar1 < dVar3) {
    raise<pstore::repo::error_code>(too_many_members_in_compilation);
  }
  local_40 = (size_type)dVar3;
  s = size_bytes(local_40);
  iVar2 = (*transaction->_vptr_transaction_base[2])(transaction,s,0x10);
  local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar2);
  ptr.super___shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_90;
  transaction_base::getrw((transaction_base *)local_88,(address)transaction,(size_t)local_90);
  std::static_pointer_cast<pstore::repo::compilation,void>((shared_ptr<void> *)(local_88 + 0x10));
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_88);
  ptr_00 = std::__shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> *)
                      (local_88 + 0x10));
  this = (compilation *)operator_new(0x50,ptr_00);
  local_b8 = last_member._M_current;
  local_b0 = first_member._M_current;
  local_a8 = triple.a_.a_;
  compilation<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
            (this,triple,local_40,first_member,last_member);
  typed_address<pstore::repo::compilation>::typed_address
            (&local_c0,
             (address)ptr.super___shared_ptr<pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  extent<pstore::repo::compilation>::extent
            ((extent<pstore::repo::compilation> *)&triple_local,local_c0,s);
  std::shared_ptr<pstore::repo::compilation>::~shared_ptr
            ((shared_ptr<pstore::repo::compilation> *)(local_88 + 0x10));
  return _triple_local;
}

Assistant:

auto compilation::alloc (TransactionType & transaction,
                                 typed_address<indirect_string> triple, Iterator first_member,
                                 Iterator last_member) -> extent<compilation> {
            // First work out its size.
            auto const dist = std::distance (first_member, last_member);
            PSTORE_ASSERT (dist >= 0);

            if (dist > std::numeric_limits<size_type>::max ()) {
                raise (error_code::too_many_members_in_compilation);
            }

            auto const num_members = static_cast<size_type> (dist);
            auto const size = size_bytes (num_members);

            // Allocate the storage.
            auto const addr = transaction.allocate (size, alignof (compilation));
            auto ptr = std::static_pointer_cast<compilation> (transaction.getrw (addr, size));

            // Write the data to the store.
            new (ptr.get ()) compilation{triple, num_members, first_member, last_member};
            return extent<compilation> (typed_address<compilation> (addr), size);
        }